

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O3

string * __thiscall
ast::Unary_expression::to_string_abi_cxx11_(string *__return_storage_ptr__,Unary_expression *this)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  switch(this->operation) {
  case 0x111:
    (*this->expression->_vptr_Expression[2])(local_30);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x12fba1);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  case 0x114:
    (*this->expression->_vptr_Expression[2])(local_30);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x13003d);
    break;
  case 0x117:
    (*this->expression->_vptr_Expression[2])(local_30);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x12fb9d);
    break;
  case 0x118:
    (*this->expression->_vptr_Expression[2])(local_30);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x12fb9f);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string Unary_expression::to_string()
{
	switch (this->operation) {
	case PLUS:
		return "+" + expression->to_string();
	case MINUS:
		return "-" + expression->to_string();
	case TILDE:
		return "~" + expression->to_string();
	case EXCLAMATION:
		return "!" + expression->to_string();
	default:
		return string();
	}
}